

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

string * get_driver(string *__return_storage_ptr__,string *tty)

{
  int iVar1;
  ssize_t sVar2;
  char *pcVar3;
  allocator local_4d8 [8];
  char buffer [1024];
  undefined1 local_d0 [8];
  stat st;
  string devicedir;
  
  std::__cxx11::string::string((string *)(st.__glibc_reserved + 2),(string *)tty);
  std::__cxx11::string::append((char *)(st.__glibc_reserved + 2));
  iVar1 = lstat((char *)st.__glibc_reserved[2],(stat *)local_d0);
  if ((iVar1 == 0) && (((uint)st.st_nlink & 0xf000) == 0xa000)) {
    memset(local_4d8,0,0x400);
    std::__cxx11::string::append((char *)(st.__glibc_reserved + 2));
    sVar2 = readlink((char *)st.__glibc_reserved[2],(char *)local_4d8,0x400);
    if (0 < sVar2) {
      pcVar3 = basename((char *)local_4d8);
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,pcVar3,
                 (allocator *)(devicedir.field_2._M_local_buf + 0xf));
      goto LAB_00104152;
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",local_4d8);
LAB_00104152:
  std::__cxx11::string::~string((string *)(st.__glibc_reserved + 2));
  return __return_storage_ptr__;
}

Assistant:

string get_driver(const string& tty) {
    struct stat st;
    string devicedir = tty;

    // Append '/device' to the tty-path
    devicedir += "/device";

    // Stat the devicedir and handle it if it is a symlink
    if (lstat(devicedir.c_str(), &st)==0 && S_ISLNK(st.st_mode)) {
        char buffer[1024];
        memset(buffer, 0, sizeof(buffer));

        // Append '/driver' and return basename of the target
        devicedir += "/driver";

        if (readlink(devicedir.c_str(), buffer, sizeof(buffer)) > 0)
            return basename(buffer);
    }
    return "";
}